

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O3

void __thiscall
iDynTree::ArticulatedBodyAlgorithmInternalBuffers::resize
          (ArticulatedBodyAlgorithmInternalBuffers *this,Model *model)

{
  DOFSpatialMotionArray::resize(&this->S,model);
  DOFSpatialForceArray::resize(&this->U,model);
  JointDOFsDoubleArray::resize(&this->D,model);
  JointDOFsDoubleArray::resize(&this->u,model);
  LinkVelArray::resize(&this->linksVel,model);
  LinkAccArray::resize(&this->linksBiasAcceleration,model);
  LinkAccArray::resize(&this->linksAccelerations,model);
  LinkArticulatedBodyInertias::resize(&this->linkABIs,model);
  LinkWrenches::resize(&this->linksBiasWrench,model);
  return;
}

Assistant:

void ArticulatedBodyAlgorithmInternalBuffers::resize(const Model& model)
{
    S.resize(model);
    U.resize(model);
    D.resize(model);
    u.resize(model);
    linksVel.resize(model);
    linksBiasAcceleration.resize(model);
    linksAccelerations.resize(model);
    linkABIs.resize(model);
    linksBiasWrench.resize(model);
    // debug
    //pa.resize(model);
}